

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O2

void __thiscall
tchecker::clockbounds::clockbounds_t::clockbounds_t
          (clockbounds_t *this,loc_id_t loc_nb,clock_id_t clock_nb)

{
  global_lu_map_t *this_00;
  global_m_map_t *this_01;
  local_lu_map_t *this_02;
  local_m_map_t *this_03;
  
  this_00 = (global_lu_map_t *)operator_new(0x18);
  global_lu_map_t::global_lu_map_t(this_00,clock_nb);
  std::__shared_ptr<tchecker::clockbounds::global_lu_map_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::clockbounds::global_lu_map_t,void>
            ((__shared_ptr<tchecker::clockbounds::global_lu_map_t,(__gnu_cxx::_Lock_policy)2> *)this
             ,this_00);
  this_01 = (global_m_map_t *)operator_new(0x10);
  global_m_map_t::global_m_map_t(this_01,clock_nb);
  std::__shared_ptr<tchecker::clockbounds::global_m_map_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::clockbounds::global_m_map_t,void>
            ((__shared_ptr<tchecker::clockbounds::global_m_map_t,(__gnu_cxx::_Lock_policy)2> *)
             &this->_global_m,this_01);
  this_02 = (local_lu_map_t *)operator_new(0x38);
  local_lu_map_t::local_lu_map_t(this_02,loc_nb,clock_nb);
  std::__shared_ptr<tchecker::clockbounds::local_lu_map_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::clockbounds::local_lu_map_t,void>
            ((__shared_ptr<tchecker::clockbounds::local_lu_map_t,(__gnu_cxx::_Lock_policy)2> *)
             &this->_local_lu,this_02);
  this_03 = (local_m_map_t *)operator_new(0x20);
  local_m_map_t::local_m_map_t(this_03,loc_nb,clock_nb);
  std::__shared_ptr<tchecker::clockbounds::local_m_map_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::clockbounds::local_m_map_t,void>
            ((__shared_ptr<tchecker::clockbounds::local_m_map_t,(__gnu_cxx::_Lock_policy)2> *)
             &this->_local_m,this_03);
  return;
}

Assistant:

clockbounds_t::clockbounds_t(tchecker::loc_id_t loc_nb, tchecker::clock_id_t clock_nb)
    : _global_lu(new tchecker::clockbounds::global_lu_map_t(clock_nb)),
      _global_m(new tchecker::clockbounds::global_m_map_t(clock_nb)),
      _local_lu(new tchecker::clockbounds::local_lu_map_t(loc_nb, clock_nb)),
      _local_m(new tchecker::clockbounds::local_m_map_t(loc_nb, clock_nb))
{
}